

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_BasicRepeatedTest_SetOption_Test::TestBody
          (ComparisonTest_BasicRepeatedTest_SetOption_Test *this)

{
  bool bVar1;
  char *message;
  TestAllTypes *this_00;
  TestAllTypes *this_01;
  AssertHelper local_60;
  Message local_58 [3];
  string local_40;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  ComparisonTest_BasicRepeatedTest_SetOption_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  ComparisonTest::repeated_field_as_set(&this->super_ComparisonTest);
  this_00 = &(this->super_ComparisonTest).proto1_;
  proto2_unittest::TestAllTypes::clear_repeated_int32(this_00);
  this_01 = &(this->super_ComparisonTest).proto2_;
  proto2_unittest::TestAllTypes::clear_repeated_int32(this_01);
  proto2_unittest::TestAllTypes::add_repeated_int32(this_00,0x1f5);
  proto2_unittest::TestAllTypes::add_repeated_int32(this_00,0x1f6);
  proto2_unittest::TestAllTypes::add_repeated_int32(this_00,0x1f7);
  proto2_unittest::TestAllTypes::add_repeated_int32(this_00,500);
  proto2_unittest::TestAllTypes::add_repeated_int32(this_00,500);
  proto2_unittest::TestAllTypes::add_repeated_int32(this_01,500);
  proto2_unittest::TestAllTypes::add_repeated_int32(this_01,0x1fd);
  proto2_unittest::TestAllTypes::add_repeated_int32(this_01,0x1f7);
  proto2_unittest::TestAllTypes::add_repeated_int32(this_01,0x1f6);
  proto2_unittest::TestAllTypes::add_repeated_int32(this_01,0x1f8);
  protobuf::(anonymous_namespace)::ComparisonTest::Run_abi_cxx11_(&local_40,this);
  testing::internal::EqHelper::
  Compare<char[229],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_20,
             "\"moved: repeated_int32[1] -> repeated_int32[3] : 502\\n\" \"moved: repeated_int32[3] -> repeated_int32[0] : 500\\n\" \"added: repeated_int32[1]: 509\\n\" \"added: repeated_int32[4]: 504\\n\" \"deleted: repeated_int32[0]: 501\\n\" \"deleted: repeated_int32[4]: 500\\n\""
             ,"Run()",(char (*) [229])
                      "moved: repeated_int32[1] -> repeated_int32[3] : 502\nmoved: repeated_int32[3] -> repeated_int32[0] : 500\nadded: repeated_int32[1]: 509\nadded: repeated_int32[4]: 504\ndeleted: repeated_int32[0]: 501\ndeleted: repeated_int32[4]: 500\n"
             ,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_58);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xd93,message);
    testing::internal::AssertHelper::operator=(&local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST_F(ComparisonTest, BasicRepeatedTest_SetOption) {
  repeated_field_as_set();
  proto1_.clear_repeated_int32();
  proto2_.clear_repeated_int32();

  proto1_.add_repeated_int32(501);
  proto1_.add_repeated_int32(502);
  proto1_.add_repeated_int32(503);
  proto1_.add_repeated_int32(500);
  proto1_.add_repeated_int32(500);

  proto2_.add_repeated_int32(500);
  proto2_.add_repeated_int32(509);
  proto2_.add_repeated_int32(503);
  proto2_.add_repeated_int32(502);
  proto2_.add_repeated_int32(504);

  EXPECT_EQ(
      "moved: repeated_int32[1] -> repeated_int32[3] : 502\n"
      "moved: repeated_int32[3] -> repeated_int32[0] : 500\n"
      "added: repeated_int32[1]: 509\n"
      "added: repeated_int32[4]: 504\n"
      "deleted: repeated_int32[0]: 501\n"
      "deleted: repeated_int32[4]: 500\n",
      Run());
}